

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O2

int Cudd_ApaPrintDecimal(FILE *fp,int digits,DdApaNumber number)

{
  bool bVar1;
  DdApaDigit DVar2;
  int iVar3;
  DdApaNumber dest;
  DdApaNumber __ptr;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  dest = Cudd_NewApaNumber(digits);
  if (dest == (DdApaNumber)0x0) {
    iVar3 = 0;
  }
  else {
    uVar5 = (uint)((double)digits * 9.632959861247398);
    __ptr = (DdApaNumber)malloc((long)(int)(uVar5 + 1));
    if (__ptr == (DdApaNumber)0x0) {
LAB_00644135:
      iVar3 = 0;
      __ptr = dest;
    }
    else {
      Cudd_ApaCopy(digits,number,dest);
      for (uVar4 = (ulong)uVar5; -1 < (int)uVar4; uVar4 = (ulong)((int)uVar4 - 1)) {
        DVar2 = Cudd_ApaShortDivision(digits,dest,10,dest);
        *(char *)((long)__ptr + uVar4) = (char)DVar2;
      }
      free(dest);
      bVar6 = true;
      for (uVar4 = 0; (long)uVar4 <= (long)(int)uVar5; uVar4 = uVar4 + 1) {
        bVar1 = !bVar6;
        bVar6 = false;
        if (((bVar1) || (bVar6 = *(char *)((long)__ptr + uVar4) == '\0', !bVar6 || uVar5 == uVar4))
           && (iVar3 = fprintf((FILE *)fp,"%1d",(ulong)*(byte *)((long)__ptr + uVar4)), dest = __ptr
              , iVar3 == -1)) goto LAB_00644135;
      }
      iVar3 = 1;
    }
    free(__ptr);
  }
  return iVar3;
}

Assistant:

int
Cudd_ApaPrintDecimal(
  FILE * fp,
  int  digits,
  DdApaNumber  number)
{
    int i, result;
    DdApaDigit remainder;
    DdApaNumber work;
    unsigned char *decimal;
    int leadingzero;
    int decimalDigits = (int) (digits * log10((double) DD_APA_BASE)) + 1;

    work = Cudd_NewApaNumber(digits);
    if (work == NULL)
        return(0);
    decimal = ABC_ALLOC(unsigned char, decimalDigits);
    if (decimal == NULL) {
        ABC_FREE(work);
        return(0);
    }
    Cudd_ApaCopy(digits,number,work);
    for (i = decimalDigits - 1; i >= 0; i--) {
        remainder = Cudd_ApaShortDivision(digits,work,(DdApaDigit) 10,work);
        decimal[i] = (unsigned char) remainder;
    }
    ABC_FREE(work);

    leadingzero = 1;
    for (i = 0; i < decimalDigits; i++) {
        leadingzero = leadingzero && (decimal[i] == 0);
        if ((!leadingzero) || (i == (decimalDigits - 1))) {
            result = fprintf(fp,"%1d",decimal[i]);
            if (result == EOF) {
                ABC_FREE(decimal);
                return(0);
            }
        }
    }
    ABC_FREE(decimal);
    return(1);

}